

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ExceptionOr<kj::AuthenticatedStream>::~ExceptionOr
          (ExceptionOr<kj::AuthenticatedStream> *this)

{
  PeerIdentity *pPVar1;
  Disposer *pDVar2;
  AsyncIoStream *pAVar3;
  
  if ((this->value).ptr.isSet == true) {
    pPVar1 = (this->value).ptr.field_1.value.peerIdentity.ptr;
    if (pPVar1 != (PeerIdentity *)0x0) {
      (this->value).ptr.field_1.value.peerIdentity.ptr = (PeerIdentity *)0x0;
      pDVar2 = (this->value).ptr.field_1.value.peerIdentity.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,pPVar1->_vptr_PeerIdentity[-2] + (long)&pPVar1->_vptr_PeerIdentity);
    }
    pAVar3 = (this->value).ptr.field_1.value.stream.ptr;
    if (pAVar3 != (AsyncIoStream *)0x0) {
      (this->value).ptr.field_1.value.stream.ptr = (AsyncIoStream *)0x0;
      pDVar2 = (this->value).ptr.field_1.value.stream.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                        (long)&(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream);
    }
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}